

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O1

void __thiscall n_e_s::core::Pipeline::execute_step(Pipeline *this)

{
  _Any_data *p_Var1;
  StepResult SVar2;
  
  while( true ) {
    p_Var1 = (_Any_data *)
             (this->steps_).
             super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((_Any_data *)
        (this->steps_).
        super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == p_Var1) {
      return;
    }
    if (*(long *)(p_Var1 + 1) == 0) break;
    SVar2 = (**(code **)((long)p_Var1 + 0x18))(p_Var1);
    std::
    deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
    ::pop_front(&this->steps_);
    this->continue_ = SVar2 != Stop;
    if (SVar2 != Skip) {
      return;
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

void Pipeline::execute_step() {
    if (!steps_.empty()) {
        const StepResult res = steps_.front()();
        steps_.pop_front();

        continue_ = res != StepResult::Stop;

        if (res == StepResult::Skip) {
            execute_step();
        }
    }
}